

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_196fac::testNonOptimized(string *tempDir)

{
  char *__filename;
  undefined8 in_RDI;
  undefined4 unaff_retaddr;
  EImageType unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  char *in_stack_00000010;
  char *filename;
  string fn;
  int pWidth;
  int pHeight;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined1 pIsStereo;
  EImageType pImageType;
  
  pImageType = 0x47f;
  pIsStereo = 0;
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  writeFile(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
            SUB41((uint)unaff_retaddr >> 0x18,0),(Compression)((ulong)in_RDI >> 0x20));
  readValidateFile((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,pImageType,(bool)pIsStereo);
  remove(__filename);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void
testNonOptimized (const std::string & tempDir)
{
    const int pHeight = IMAGE_2K_HEIGHT - 1;
    const int pWidth  =  IMAGE_2K_WIDTH - 1;
    std::string fn = tempDir +  RGB_FILENAME;
    const char* filename  = fn.c_str();

    remove(filename);
    writeFile (filename,  pHeight, pWidth, IMAGE_TYPE_OTHER,  false, NO_COMPRESSION);
    readValidateFile(filename,pHeight,pWidth,IMAGE_TYPE_OTHER,false);
    remove(filename);
}